

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O2

SRes Lzma2Dec_DecodeToDic
               (CLzma2Dec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  SizeT *pSVar1;
  UInt32 *pUVar2;
  SizeT SVar3;
  int __result__;
  SRes SVar4;
  ELzmaStatus EVar5;
  UInt32 UVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  SizeT SVar14;
  UInt32 UVar15;
  SizeT srcSizeCur;
  SizeT local_50;
  SizeT local_48;
  ELzmaStatus *local_40;
  SizeT *local_38;
  
  local_48 = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  SVar14 = local_48;
  local_50 = dicLimit;
  local_40 = status;
  local_38 = srcLen;
  do {
    while( true ) {
      uVar7 = p->state;
      if (uVar7 == 8) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
        return 0;
      }
      if (uVar7 == 9) {
        return 1;
      }
      SVar3 = (p->decoder).dicPos;
      uVar10 = dicLimit - SVar3;
      if (uVar10 == 0 && finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return 0;
      }
      if ((uVar7 & 0xfffffffe) != 6) break;
      srcSizeCur = SVar14 - *srcLen;
      uVar12 = (ulong)p->unpackSize;
      uVar13 = uVar12;
      if (uVar12 > uVar10) {
        uVar13 = uVar10;
      }
      bVar8 = p->control;
      if ((char)bVar8 < '\0') {
        if (uVar7 == 6) {
          bVar8 = bVar8 >> 5 & 3;
          if ((bVar8 != 3) && ((p->needInitDic != 0 || ((bVar8 == 0 && (p->needInitState != 0))))))
          goto LAB_00661dba;
          LzmaDec_InitDicAndState(&p->decoder,(uint)(bVar8 == 3),(uint)(bVar8 != 0));
          p->needInitDic = 0;
          p->needInitState = 0;
          p->state = 7;
        }
        status = local_40;
        if (p->packSize < srcSizeCur) {
          srcSizeCur = (ulong)p->packSize;
        }
        SVar4 = LzmaDec_DecodeToDic(&p->decoder,uVar13 + SVar3,src,&srcSizeCur,
                                    (uint)(uVar12 <= uVar10),local_40);
        *local_38 = *local_38 + srcSizeCur;
        UVar6 = p->packSize;
        p->packSize = UVar6 - (UInt32)srcSizeCur;
        SVar14 = (p->decoder).dicPos;
        UVar15 = ((int)SVar3 - (int)SVar14) + p->unpackSize;
        p->unpackSize = UVar15;
        if (SVar4 != 0) {
          return SVar4;
        }
        EVar5 = *status;
        if (EVar5 == LZMA_STATUS_NEEDS_MORE_INPUT) {
          return 0;
        }
        if (SVar3 == SVar14 && srcSizeCur == 0) {
          if (((EVar5 != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) || (UVar15 != 0)) ||
             (UVar6 != (UInt32)srcSizeCur)) goto LAB_00661dba;
          p->state = 0;
          EVar5 = *status;
        }
        src = src + srcSizeCur;
        dicLimit = local_50;
        srcLen = local_38;
        SVar14 = local_48;
        if (EVar5 == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) {
          *status = LZMA_STATUS_NOT_FINISHED;
        }
      }
      else {
        if (SVar14 == *srcLen) {
          *local_40 = LZMA_STATUS_NEEDS_MORE_INPUT;
          return 0;
        }
        if (uVar7 == 6) {
          if (bVar8 == 1) {
            p->needInitState = 1;
            p->needInitProp = 1;
          }
          else if (p->needInitDic != 0) goto LAB_00661dba;
          p->needInitDic = 0;
          LzmaDec_InitDicAndState(&p->decoder,(uint)(bVar8 == 1),0);
        }
        if (uVar13 < srcSizeCur) {
          srcSizeCur = uVar13;
        }
        SVar14 = srcSizeCur;
        if (srcSizeCur == 0) {
LAB_00661dba:
          p->state = 9;
          return 1;
        }
        memcpy((p->decoder).dic + (p->decoder).dicPos,src,srcSizeCur);
        pSVar1 = &(p->decoder).dicPos;
        *pSVar1 = *pSVar1 + SVar14;
        if ((p->decoder).checkDicSize == 0) {
          UVar15 = (p->decoder).prop.dicSize;
          UVar6 = (p->decoder).processedPos;
          if (UVar15 - UVar6 <= SVar14) {
            (p->decoder).checkDicSize = UVar15;
          }
        }
        else {
          UVar6 = (p->decoder).processedPos;
        }
        (p->decoder).processedPos = (int)SVar14 + UVar6;
        *local_38 = *local_38 + srcSizeCur;
        src = src + srcSizeCur;
        pUVar2 = &p->unpackSize;
        *pUVar2 = *pUVar2 - (int)srcSizeCur;
        uVar7 = 7;
        if (*pUVar2 == 0) {
          uVar7 = 0;
        }
        p->state = uVar7;
        status = local_40;
        dicLimit = local_50;
        srcLen = local_38;
        SVar14 = local_48;
      }
    }
    if (*srcLen == SVar14) {
      *status = LZMA_STATUS_NEEDS_MORE_INPUT;
      return 0;
    }
    *srcLen = *srcLen + 1;
    uVar9 = 9;
    if (uVar7 < 6) {
      bVar8 = *src;
      uVar11 = (uint)bVar8;
      switch(uVar7) {
      case 0:
        p->control = bVar8;
        uVar9 = 8;
        if (bVar8 != 0) {
          if ((char)bVar8 < '\0') {
            p->unpackSize = (uVar11 & 0x1f) << 0x10;
          }
          else {
            uVar9 = 9;
            if (2 < bVar8) break;
            p->unpackSize = 0;
          }
          uVar9 = 1;
        }
        break;
      case 1:
        p->unpackSize = p->unpackSize | uVar11 << 8;
        uVar9 = 2;
        break;
      case 2:
        p->unpackSize = (uVar11 | p->unpackSize) + 1;
        uVar9 = (uint)(-1 < (char)p->control) * 3 + 3;
        break;
      case 3:
        p->packSize = uVar11 << 8;
        uVar9 = 4;
        break;
      case 4:
        p->packSize = (uVar11 | p->packSize) + 1;
        uVar9 = 5;
        if ((p->control & 0x40) == 0) {
          uVar9 = (uint)(p->needInitProp != 0) * 3 + 6;
        }
        break;
      case 5:
        uVar9 = 9;
        if (bVar8 < 0xe1) {
          (p->decoder).prop.pb = (uint)(bVar8 / 0x2d);
          uVar7 = (uint)(byte)((ushort)(bVar8 / 9) % 5);
          uVar9 = 9;
          if (uVar7 + bVar8 % 9 < 5) {
            (p->decoder).prop.lc = (uint)(bVar8 % 9);
            (p->decoder).prop.lp = uVar7;
            p->needInitProp = 0;
            uVar9 = 6;
          }
        }
      }
    }
    src = src + 1;
    uVar7 = uVar9;
    if (dicLimit == SVar3 && uVar9 != 8) {
      uVar7 = 9;
    }
    p->state = uVar7;
    if (dicLimit == SVar3 && uVar9 != 8) {
      return 1;
    }
  } while( true );
}

Assistant:

SRes Lzma2Dec_DecodeToDic(CLzma2Dec *p, SizeT dicLimit,
    const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->state != LZMA2_STATE_FINISHED)
  {
    SizeT dicPos = p->decoder.dicPos;
    
    if (p->state == LZMA2_STATE_ERROR)
      return SZ_ERROR_DATA;
    
    if (dicPos == dicLimit && finishMode == LZMA_FINISH_ANY)
    {
      *status = LZMA_STATUS_NOT_FINISHED;
      return SZ_OK;
    }

    if (p->state != LZMA2_STATE_DATA && p->state != LZMA2_STATE_DATA_CONT)
    {
      if (*srcLen == inSize)
      {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      (*srcLen)++;
      p->state = Lzma2Dec_UpdateState(p, *src++);

      if (dicPos == dicLimit && p->state != LZMA2_STATE_FINISHED)
      {
        p->state = LZMA2_STATE_ERROR;
        return SZ_ERROR_DATA;
      }
      continue;
    }
    
    {
      SizeT destSizeCur = dicLimit - dicPos;
      SizeT srcSizeCur = inSize - *srcLen;
      ELzmaFinishMode curFinishMode = LZMA_FINISH_ANY;
      
      if (p->unpackSize <= destSizeCur)
      {
        destSizeCur = (SizeT)p->unpackSize;
        curFinishMode = LZMA_FINISH_END;
      }

      if (LZMA2_IS_UNCOMPRESSED_STATE(p))
      {
        if (*srcLen == inSize)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }

        if (p->state == LZMA2_STATE_DATA)
        {
          Bool initDic = (p->control == LZMA2_CONTROL_COPY_RESET_DIC);
          if (initDic)
            p->needInitProp = p->needInitState = True;
          else if (p->needInitDic)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->needInitDic = False;
          LzmaDec_InitDicAndState(&p->decoder, initDic, False);
        }

        if (srcSizeCur > destSizeCur)
          srcSizeCur = destSizeCur;

        if (srcSizeCur == 0)
        {
          p->state = LZMA2_STATE_ERROR;
          return SZ_ERROR_DATA;
        }

        LzmaDec_UpdateWithUncompressed(&p->decoder, src, srcSizeCur);

        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->unpackSize -= (UInt32)srcSizeCur;
        p->state = (p->unpackSize == 0) ? LZMA2_STATE_CONTROL : LZMA2_STATE_DATA_CONT;
      }
      else
      {
        SizeT outSizeProcessed;
        SRes res;

        if (p->state == LZMA2_STATE_DATA)
        {
          unsigned mode = LZMA2_GET_LZMA_MODE(p);
          Bool initDic = (mode == 3);
          Bool initState = (mode != 0);
          if ((!initDic && p->needInitDic) || (!initState && p->needInitState))
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          
          LzmaDec_InitDicAndState(&p->decoder, initDic, initState);
          p->needInitDic = False;
          p->needInitState = False;
          p->state = LZMA2_STATE_DATA_CONT;
        }
  
        if (srcSizeCur > p->packSize)
          srcSizeCur = (SizeT)p->packSize;
          
        res = LzmaDec_DecodeToDic(&p->decoder, dicPos + destSizeCur, src, &srcSizeCur, curFinishMode, status);
        
        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->packSize -= (UInt32)srcSizeCur;

        outSizeProcessed = p->decoder.dicPos - dicPos;
        p->unpackSize -= (UInt32)outSizeProcessed;

        RINOK(res);
        if (*status == LZMA_STATUS_NEEDS_MORE_INPUT)
          return res;

        if (srcSizeCur == 0 && outSizeProcessed == 0)
        {
          if (*status != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK
              || p->unpackSize != 0
              || p->packSize != 0)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->state = LZMA2_STATE_CONTROL;
        }
        
        if (*status == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
          *status = LZMA_STATUS_NOT_FINISHED;
      }
    }
  }
  
  *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return SZ_OK;
}